

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDynamicLoader.cxx
# Opt level: O2

bool __thiscall
cmDynamicLoaderCache::GetCacheFile(cmDynamicLoaderCache *this,char *path,LibraryHandle *p)

{
  iterator iVar1;
  _Rb_tree_header *p_Var2;
  allocator local_39;
  key_type local_38;
  
  std::__cxx11::string::string((string *)&local_38,path,&local_39);
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
                  *)this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  p_Var2 = &(this->CacheMap)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)iVar1._M_node != p_Var2) {
    *p = *(LibraryHandle *)(iVar1._M_node + 2);
  }
  return (_Rb_tree_header *)iVar1._M_node != p_Var2;
}

Assistant:

bool cmDynamicLoaderCache::GetCacheFile(const char* path,
  cmsys::DynamicLoader::LibraryHandle& p)
{
  std::map<std::string, cmsys::DynamicLoader::LibraryHandle>::iterator it
    = this->CacheMap.find(path);
  if ( it != this->CacheMap.end() )
    {
    p = it->second;
    return true;
    }
  return false;
}